

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

bool __thiscall
duckdb::BitpackingState<short,short>::
Flush<duckdb::BitpackingCompressionState<short,true,short>::BitpackingWriter>
          (BitpackingState<short,short> *this)

{
  byte width;
  byte bVar1;
  bitpacking_width_t width_00;
  idx_t iVar2;
  bool bVar3;
  
  bVar3 = true;
  if (*(idx_t *)(this + 0x2810) != 0) {
    if (((this[0x2837] == (BitpackingState<short,short>)0x0) &&
        (*(short *)(this + 0x282a) != *(short *)(this + 0x2828))) ||
       (1 < (byte)((char)this[0x283a] - 1U))) {
      BitpackingState<short,_short>::CalculateFORStats((BitpackingState<short,_short> *)this);
      BitpackingState<short,_short>::CalculateDeltaStats((BitpackingState<short,_short> *)this);
      if (this[0x2838] == (BitpackingState<short,short>)0x1) {
        if ((*(short *)(this + 0x2830) == *(short *)(this + 0x282e)) &&
           (((byte)this[0x283a] & 0xfe) != 4)) {
          BitpackingCompressionState<short,_true,_short>::BitpackingWriter::WriteConstantDelta
                    (*(short *)(this + 0x2830),**(short **)(this + 0x1008),*(idx_t *)(this + 0x2810)
                     ,*(short **)(this + 0x1008),(bool *)(this + 0x2010),*(void **)(this + 0x2820));
          *(long *)(this + 0x2818) = *(long *)(this + 0x2818) + 8;
          return true;
        }
        width = BitpackingPrimitives::MinimumBitWidth<short,false>(*(short *)(this + 0x2832));
        bVar1 = BitpackingPrimitives::MinimumBitWidth<short,true>(*(short *)(this + 0x282c));
        if ((width < bVar1) && (this[0x283a] != (BitpackingState<short,short>)0x5)) {
          BitpackingState<short,_short>::SubtractFrameOfReference<short>
                    ((BitpackingState<short,_short> *)this,(short *)(this + 0x1010),
                     *(short *)(this + 0x282e));
          BitpackingCompressionState<short,_true,_short>::BitpackingWriter::WriteDeltaFor
                    ((short *)(this + 0x1010),(bool *)(this + 0x2010),width,
                     *(short *)(this + 0x282e),*(short *)(this + 0x2834),*(short **)(this + 0x1008),
                     *(idx_t *)(this + 0x2810),*(void **)(this + 0x2820));
          *(long *)(this + 0x2818) = *(long *)(this + 0x2818) + 0xc;
          iVar2 = BitpackingPrimitives::GetRequiredSize(*(idx_t *)(this + 0x2810),width);
          *(idx_t *)(this + 0x2818) = *(long *)(this + 0x2818) + iVar2;
          return true;
        }
      }
      if (this[0x2839] == (BitpackingState<short,short>)0x1) {
        width_00 = BitpackingPrimitives::MinimumBitWidth<short,false>(*(short *)(this + 0x282c));
        BitpackingState<short,_short>::SubtractFrameOfReference<short>
                  ((BitpackingState<short,_short> *)this,*(short **)(this + 0x1008),
                   *(short *)(this + 0x2828));
        BitpackingCompressionState<short,_true,_short>::BitpackingWriter::WriteFor
                  (*(short **)(this + 0x1008),(bool *)(this + 0x2010),width_00,
                   *(short *)(this + 0x2828),*(idx_t *)(this + 0x2810),*(void **)(this + 0x2820));
        iVar2 = BitpackingPrimitives::GetRequiredSize(*(idx_t *)(this + 0x2810),width_00);
        *(idx_t *)(this + 0x2818) = iVar2 + *(long *)(this + 0x2818) + 10;
      }
      else {
        bVar3 = false;
      }
    }
    else {
      BitpackingCompressionState<short,_true,_short>::BitpackingWriter::WriteConstant
                (*(short *)(this + 0x282a),*(idx_t *)(this + 0x2810),*(void **)(this + 0x2820),
                 (bool)this[0x2837]);
      *(long *)(this + 0x2818) = *(long *)(this + 0x2818) + 6;
    }
  }
  return bVar3;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}